

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

int NULLCTypeInfo::TypeArgumentCount(int *typeID)

{
  uint *puVar1;
  uint uVar2;
  char *__function;
  long lVar3;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0xec,"int NULLCTypeInfo::TypeArgumentCount(int *)");
  }
  if ((uint)*typeID < *(uint *)(linker + 0x20c)) {
    lVar3 = (ulong)(uint)*typeID * 0x50;
    puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar3);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar3) == 3) {
      uVar2 = puVar1[6];
    }
    else {
      uVar2 = *puVar1;
      if (*(uint *)(linker + 0x29c) <= uVar2) {
        __function = 
        "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_001233c3;
      }
      nullcThrowError("typeid::argumentCount received type (%s) that is not a function",
                      (ulong)uVar2 + *(long *)(linker + 0x290));
      uVar2 = 0xffffffff;
    }
    return uVar2;
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_001233c3:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

int TypeArgumentCount(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::argumentCount received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return -1;
		}
		return type.memberCount;
	}